

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_hatch.cpp
# Opt level: O0

ON_ClassId * __thiscall ON_OBSOLETE_V5_HatchExtra::ClassId(ON_OBSOLETE_V5_HatchExtra *this)

{
  ON_OBSOLETE_V5_HatchExtra *this_local;
  
  return &m_ON_OBSOLETE_V5_HatchExtra_class_rtti;
}

Assistant:

ON_OBSOLETE_V5_HatchExtra* ON_OBSOLETE_V5_HatchExtra::HatchExtension(const ON_Hatch* pHatch)
{
  ON_OBSOLETE_V5_HatchExtra* pExtra = nullptr;
  if(pHatch)
  {
    pExtra = ON_OBSOLETE_V5_HatchExtra::Cast(pHatch->GetUserData(ON_CLASS_ID(ON_OBSOLETE_V5_HatchExtra)));
    if(pExtra == nullptr)
    {
      pExtra = new ON_OBSOLETE_V5_HatchExtra;
      if(pExtra)
      {
        if(!const_cast<ON_Hatch*>(pHatch)->AttachUserData(pExtra))
        {
          delete pExtra;
          pExtra = nullptr;
        }
      }  
    }
  }
  return pExtra;
}